

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall google::protobuf::Symbol::GetFile(Symbol *this)

{
  Descriptor *this_00;
  EnumDescriptor *this_01;
  ServiceDescriptor *this_02;
  Symbol *this_local;
  
  switch(this->type) {
  case NULL_SYMBOL:
    this_local = (Symbol *)0x0;
    break;
  case MESSAGE:
    this_local = (Symbol *)Descriptor::file((this->field_1).descriptor);
    break;
  case FIELD:
    this_local = (Symbol *)FieldDescriptor::file((this->field_1).field_descriptor);
    break;
  case ONEOF:
    this_00 = OneofDescriptor::containing_type((this->field_1).oneof_descriptor);
    this_local = (Symbol *)Descriptor::file(this_00);
    break;
  case ENUM:
    this_local = (Symbol *)EnumDescriptor::file((this->field_1).enum_descriptor);
    break;
  case ENUM_VALUE:
    this_01 = EnumValueDescriptor::type((this->field_1).enum_value_descriptor);
    this_local = (Symbol *)EnumDescriptor::file(this_01);
    break;
  case SERVICE:
    this_local = (Symbol *)ServiceDescriptor::file((this->field_1).service_descriptor);
    break;
  case METHOD:
    this_02 = MethodDescriptor::service((this->field_1).method_descriptor);
    this_local = (Symbol *)ServiceDescriptor::file(this_02);
    break;
  case PACKAGE:
    this_local = (Symbol *)(this->field_1).descriptor;
    break;
  default:
    this_local = (Symbol *)0x0;
  }
  return (FileDescriptor *)this_local;
}

Assistant:

const FileDescriptor* GetFile() const {
    switch (type) {
      case NULL_SYMBOL:
        return NULL;
      case MESSAGE:
        return descriptor->file();
      case FIELD:
        return field_descriptor->file();
      case ONEOF:
        return oneof_descriptor->containing_type()->file();
      case ENUM:
        return enum_descriptor->file();
      case ENUM_VALUE:
        return enum_value_descriptor->type()->file();
      case SERVICE:
        return service_descriptor->file();
      case METHOD:
        return method_descriptor->service()->file();
      case PACKAGE:
        return package_file_descriptor;
    }
    return NULL;
  }